

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int l_strcmp(TString *ts1,TString *ts2)

{
  int iVar1;
  TString *pTVar2;
  TString *pTVar3;
  char **__s2;
  TString *pTVar4;
  TString *pTVar5;
  char **__s1;
  
  pTVar4 = (TString *)(long)ts1->shrlen;
  if ((long)pTVar4 < 0) {
    pTVar4 = (ts1->u).hnext;
    __s1 = (char **)ts1->contents;
  }
  else {
    __s1 = &ts1->contents;
  }
  pTVar5 = (TString *)(long)ts2->shrlen;
  if ((long)pTVar5 < 0) {
    pTVar5 = (ts2->u).hnext;
    __s2 = (char **)ts2->contents;
  }
  else {
    __s2 = &ts2->contents;
  }
  while( true ) {
    iVar1 = strcoll((char *)__s1,(char *)__s2);
    if (iVar1 != 0) {
      return iVar1;
    }
    pTVar2 = (TString *)strlen((char *)__s1);
    pTVar3 = (TString *)strlen((char *)__s2);
    if (pTVar3 == pTVar5) break;
    if (pTVar2 == pTVar4) {
      return -1;
    }
    __s1 = (char **)((long)__s1 + (long)pTVar2 + 1);
    pTVar4 = (TString *)((long)pTVar4 - (long)((long)&pTVar2->next + 1));
    __s2 = (char **)((char *)((long)__s2 + (long)pTVar3) + 1);
    pTVar5 = (TString *)((long)pTVar5 - (long)((long)&pTVar3->next + 1));
  }
  return (uint)(pTVar2 != pTVar4);
}

Assistant:

static int l_strcmp (const TString *ts1, const TString *ts2) {
  size_t rl1;  /* real length */
  const char *s1 = getlstr(ts1, rl1);
  size_t rl2;
  const char *s2 = getlstr(ts2, rl2);
  for (;;) {  /* for each segment */
    int temp = strcoll(s1, s2);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t zl1 = strlen(s1);  /* index of first '\0' in 's1' */
      size_t zl2 = strlen(s2);  /* index of first '\0' in 's2' */
      if (zl2 == rl2)  /* 's2' is finished? */
        return (zl1 == rl1) ? 0 : 1;  /* check 's1' */
      else if (zl1 == rl1)  /* 's1' is finished? */
        return -1;  /* 's1' is less than 's2' ('s2' is not finished) */
      /* both strings longer than 'zl'; go on comparing after the '\0' */
      zl1++; zl2++;
      s1 += zl1; rl1 -= zl1; s2 += zl2; rl2 -= zl2;
    }
  }
}